

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O1

double TasGrid::Optimizer::getValue<(TasGrid::TypeOneDRule)19>
                 (CurrentNodes<(TasGrid::TypeOneDRule)19> *current,double x)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  vector<double,_std::allocator<double>_> *__range2;
  bool bVar4;
  OptimizerResult OVar5;
  CurrentNodes<(TasGrid::TypeOneDRule)20> companion;
  double local_78;
  CurrentNodes<(TasGrid::TypeOneDRule)20> local_68;
  
  pdVar3 = (current->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (current->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = pdVar3 == pdVar2;
  if (!bVar4) {
    dVar1 = *pdVar3;
    while (1e-11 <= ABS(x - dVar1)) {
      pdVar3 = pdVar3 + 1;
      bVar4 = pdVar3 == pdVar2;
      if (bVar4) goto LAB_001c5180;
      dVar1 = *pdVar3;
    }
    if (!bVar4) {
      return -1e+100;
    }
  }
LAB_001c5180:
  CurrentNodes<(TasGrid::TypeOneDRule)20>::CurrentNodes(&local_68,&current->nodes,x);
  OVar5 = computeMaximum<(TasGrid::TypeOneDRule)20>(&local_68);
  if (local_68.coeff_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.coeff_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.coeff_less1.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.coeff_less1.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  local_78 = -OVar5.value;
  if (local_68.nodes_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.nodes_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.nodes_less1.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.nodes_less1.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return local_78;
}

Assistant:

double getValue<rule_mindelta>(CurrentNodes<rule_mindelta> const& current, double x){
    for(auto n : current.nodes) if (std::abs(x - n) < 10 * Maths::num_tol) return -1.E+100;

    CurrentNodes<rule_mindeltaodd> companion(current.nodes, x);
    return - computeMaximum(companion).value;
}